

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-calcs.c
# Opt level: O1

void calc_mana(player *p,player_state_conflict *state,_Bool update)

{
  uint32_t *puVar1;
  _Bool _Var2;
  int16_t iVar3;
  wchar_t wVar4;
  object *obj;
  int iVar5;
  int iVar6;
  int iVar7;
  
  if ((p->class->magic).total_spells == L'\0') {
    p->msp = 0;
    p->csp = 0;
    p->csp_frac = 0;
  }
  else {
    iVar5 = 0;
    iVar7 = (int)p->lev - (p->class->magic).spell_first;
    iVar6 = 0;
    if (-1 < iVar7) {
      wVar4 = average_spell_stat(p,state);
      iVar6 = ((iVar7 + 1) * adj_mag_mana[wVar4]) / 100 + 1;
    }
    state->cumber_armor = false;
    if ((p->body).count != 0) {
      wVar4 = L'\0';
      iVar5 = 0;
      do {
        obj = slot_object(p,wVar4);
        _Var2 = slot_type_is(p,wVar4,L'\x01');
        if (!_Var2) {
          _Var2 = slot_type_is(p,wVar4,L'\x02');
          if (!_Var2) {
            _Var2 = slot_type_is(p,wVar4,L'\x03');
            if (!_Var2) {
              _Var2 = slot_type_is(p,wVar4,L'\x04');
              if (!_Var2) {
                _Var2 = slot_type_is(p,wVar4,L'\x05');
                if (obj != (object *)0x0 && !_Var2) {
                  iVar3 = object_weight_one(obj);
                  iVar5 = iVar5 + iVar3;
                }
              }
            }
          }
        }
        wVar4 = wVar4 + L'\x01';
      } while ((uint)wVar4 < (uint)(p->body).count);
    }
    iVar5 = iVar5 - (p->class->magic).spell_weight;
    if (9 < iVar5) {
      iVar5 = (int)((ulong)((long)iVar5 * -0x66666667) >> 0x20);
      state->cumber_armor = true;
      iVar6 = ((iVar5 >> 2) - (iVar5 >> 0x1f)) + iVar6;
    }
    iVar5 = 0;
    if (0 < iVar6) {
      iVar5 = iVar6;
    }
    if ((update) && (iVar5 != p->msp)) {
      p->msp = (int16_t)iVar5;
      if (iVar5 <= p->csp) {
        p->csp = (int16_t)iVar5;
        p->csp_frac = 0;
      }
      puVar1 = &p->upkeep->redraw;
      *puVar1 = *puVar1 | 0x80;
    }
  }
  return;
}

Assistant:

static void calc_mana(struct player *p, struct player_state *state, bool update)
{
	int i, msp, levels, cur_wgt, max_wgt; 

	/* Must be literate */
	if (!p->class->magic.total_spells) {
		p->msp = 0;
		p->csp = 0;
		p->csp_frac = 0;
		return;
	}

	/* Extract "effective" player level */
	levels = (p->lev - p->class->magic.spell_first) + 1;
	if (levels > 0) {
		msp = 1;
		msp += adj_mag_mana[average_spell_stat(p, state)] * levels / 100;
	} else {
		levels = 0;
		msp = 0;
	}

	/* Assume player not encumbered by armor */
	state->cumber_armor = false;

	/* Weigh the armor */
	cur_wgt = 0;
	for (i = 0; i < p->body.count; i++) {
		struct object *obj_local = slot_object(p, i);

		/* Ignore non-armor */
		if (slot_type_is(p, i, EQUIP_WEAPON)) continue;
		if (slot_type_is(p, i, EQUIP_BOW)) continue;
		if (slot_type_is(p, i, EQUIP_RING)) continue;
		if (slot_type_is(p, i, EQUIP_AMULET)) continue;
		if (slot_type_is(p, i, EQUIP_LIGHT)) continue;

		/* Add weight */
		if (obj_local)
			cur_wgt += object_weight_one(obj_local);
	}

	/* Determine the weight allowance */
	max_wgt = p->class->magic.spell_weight;

	/* Heavy armor penalizes mana */
	if (((cur_wgt - max_wgt) / 10) > 0) {
		/* Encumbered */
		state->cumber_armor = true;

		/* Reduce mana */
		msp -= ((cur_wgt - max_wgt) / 10);
	}

	/* Mana can never be negative */
	if (msp < 0) msp = 0;

	/* Return if no updates */
	if (!update) return;

	/* Maximum mana has changed */
	if (p->msp != msp) {
		/* Save new limit */
		p->msp = msp;

		/* Enforce new limit */
		if (p->csp >= msp) {
			p->csp = msp;
			p->csp_frac = 0;
		}

		/* Display mana later */
		p->upkeep->redraw |= (PR_MANA);
	}
}